

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreTypeOperations.cpp
# Opt level: O2

pair<helics::CoreType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* helics::core::extractCoreType_abi_cxx11_(int argc,char **argv)

{
  CoreType CVar1;
  char *extraout_RDX;
  pair<helics::CoreType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  string_view type;
  string namestring;
  string corestring;
  helicsCLI11App *local_60;
  int local_54;
  char **local_50;
  string local_48;
  string local_28;
  
  local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
  local_28._M_string_length = 0;
  local_28.field_2._M_local_buf[0] = '\0';
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  anon_unknown_5::makeCLITypeApp((anon_unknown_5 *)&local_60,&local_28,&local_48);
  helicsCLI11App::helics_parse<int&,char**&>(local_60,&local_54,&local_50);
  if ((core *)local_28._M_string_length == (core *)0x0) {
    in_RDI->first = DEFAULT;
    std::__cxx11::string::string((string *)&in_RDI->second,&local_48);
  }
  else {
    type._M_str = extraout_RDX;
    type._M_len = (size_t)local_28._M_dataplus._M_p;
    CVar1 = coreTypeFromString((core *)local_28._M_string_length,type);
    in_RDI->first = CVar1;
    std::__cxx11::string::string((string *)&in_RDI->second,&local_48);
  }
  if (local_60 != (helicsCLI11App *)0x0) {
    (*(local_60->super_App)._vptr_App[1])();
  }
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return in_RDI;
}

Assistant:

std::pair<CoreType, std::string> extractCoreType(int argc, char* argv[])
{
    std::string corestring;
    std::string namestring;
    auto app = makeCLITypeApp(corestring, namestring);
    app->helics_parse(argc, argv);
    if (corestring.empty()) {
        return {CoreType::DEFAULT, namestring};
    }
    return {coreTypeFromString(corestring), namestring};
}